

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_mul_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  fVar5 = c->in[1].m_data[0];
  fVar6 = c->in[1].m_data[1];
  fVar7 = c->in[1].m_data[2];
  fVar8 = c->in[1].m_data[3];
  uVar15 = (uint)fVar1;
  uVar17 = (uint)fVar2;
  uVar19 = (uint)fVar3;
  uVar21 = (uint)fVar4;
  iVar16 = (int)fVar5;
  iVar18 = (int)fVar6;
  iVar20 = (int)fVar7;
  iVar22 = (int)fVar8;
  auVar9._0_4_ = (int)(fVar5 - 2.1474836e+09);
  auVar9._4_4_ = (int)(fVar6 - 2.1474836e+09);
  auVar9._8_4_ = (int)(fVar7 - 2.1474836e+09);
  auVar9._12_4_ = (int)(fVar8 - 2.1474836e+09);
  auVar11._0_4_ = iVar16 >> 0x1f;
  auVar11._4_4_ = iVar18 >> 0x1f;
  auVar11._8_4_ = iVar20 >> 0x1f;
  auVar11._12_4_ = iVar22 >> 0x1f;
  auVar12._4_4_ = iVar18;
  auVar12._0_4_ = iVar16;
  auVar12._8_4_ = iVar20;
  auVar12._12_4_ = iVar22;
  auVar12 = auVar11 & auVar9 | auVar12;
  auVar10._4_4_ = auVar12._8_4_;
  auVar10._0_4_ = auVar12._12_4_;
  auVar10._8_4_ = auVar12._4_4_;
  auVar10._12_4_ = auVar12._0_4_;
  uVar17 = auVar12._12_4_ * ((int)uVar17 >> 0x1f & (int)(fVar2 - 2.1474836e+09) | uVar17);
  auVar13._0_8_ = auVar12._8_8_;
  auVar13._8_4_ = auVar12._0_4_;
  auVar13._12_4_ = auVar12._4_4_;
  uVar19 = auVar12._8_4_ * ((int)uVar19 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar19);
  uVar14 = (uint)((auVar13._8_8_ & 0xffffffff) *
                 (ulong)((int)uVar15 >> 0x1f & (int)(fVar1 - 2.1474836e+09) | uVar15));
  uVar15 = (uint)((auVar10._8_8_ & 0xffffffff) *
                 (ulong)((int)uVar21 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar21));
  (c->color).m_data[0] =
       ((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar17 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[1] =
       ((float)(uVar19 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar19 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[2] =
       ((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar15 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[3] =
       ((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar14 & 0xffff | 0x4b000000)
  ;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }